

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.c
# Opt level: O0

int equal_calendar_record(calendar_record_t *a,calendar_record_t *b)

{
  int iVar1;
  bool local_19;
  calendar_record_t *b_local;
  calendar_record_t *a_local;
  
  iVar1 = strcmp(a->service_id,b->service_id);
  local_19 = false;
  if (iVar1 == 0) {
    iVar1 = strcmp(a->start_date,b->start_date);
    local_19 = false;
    if (iVar1 == 0) {
      iVar1 = strcmp(a->end_date,b->end_date);
      local_19 = false;
      if ((((iVar1 == 0) && (local_19 = false, a->monday == b->monday)) &&
          (local_19 = false, a->tuesday == b->tuesday)) &&
         (((local_19 = false, a->wednesday == b->wednesday &&
           (local_19 = false, a->thursday == b->thursday)) &&
          ((local_19 = false, a->friday == b->friday &&
           (local_19 = false, a->saturday == b->saturday)))))) {
        local_19 = a->sunday == b->sunday;
      }
    }
  }
  return (int)local_19;
}

Assistant:

int equal_calendar_record(const calendar_record_t *a, const calendar_record_t *b) {
    return (!strcmp(a->service_id, b->service_id) &&
             !strcmp(a->start_date, b->start_date) &&
             !strcmp(a->end_date, b->end_date) &&
             a->monday == b->monday &&
             a->tuesday == b->tuesday &&
             a->wednesday == b->wednesday &&
             a->thursday == b->thursday &&
             a->friday == b->friday &&
             a->saturday == b->saturday &&
             a->sunday == b->sunday);
}